

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall google::protobuf::internal::ExtensionSet::Erase(ExtensionSet *this,int key)

{
  int iVar1;
  KeyValue *this_00;
  uint16_t uVar2;
  long lVar3;
  long lVar4;
  int local_c;
  
  uVar2 = this->flat_size_;
  this_00 = (this->map_).flat;
  local_c = key;
  if ((long)(short)uVar2 < 0) {
    absl::lts_20250127::container_internal::
    btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
    ::erase<int>((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                  *)this_00,&local_c);
  }
  else if (uVar2 != 0) {
    lVar4 = (long)(short)uVar2 * 0x20;
    lVar3 = 0;
    do {
      iVar1 = *(int *)((long)&((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                                *)(&(this_00->second).cached_size + -5))->root_ + lVar3);
      if (iVar1 != key && key <= iVar1) {
        return;
      }
      if (iVar1 == key) {
        if (lVar4 + -0x20 != lVar3) {
          memmove((void *)((long)&((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                                    *)(&(this_00->second).cached_size + -5))->root_ + lVar3),
                  (void *)((long)(&this_00[1].second.cached_size + -5) + lVar3),
                  (lVar4 - lVar3) - 0x20);
          uVar2 = this->flat_size_;
        }
        this->flat_size_ = uVar2 - 1;
        return;
      }
      lVar3 = lVar3 + 0x20;
    } while (lVar4 != lVar3);
  }
  return;
}

Assistant:

void ExtensionSet::Erase(int key) {
  if (ABSL_PREDICT_FALSE(is_large())) {
    map_.large->erase(key);
    return;
  }
  KeyValue* end = flat_end();
  for (KeyValue* it = flat_begin(); it != end && it->first <= key; ++it) {
    if (it->first == key) {
      std::copy(it + 1, end, it);
      --flat_size_;
      return;
    }
  }
}